

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# es3sDrawTests.cpp
# Opt level: O0

IterateResult __thiscall
deqp::gles3::Stress::anon_unknown_0::DrawInvalidRangeCase::iterate(DrawInvalidRangeCase *this)

{
  int iVar1;
  deUint32 dVar2;
  GLuint index;
  int height;
  GLenum GVar3;
  RenderContext *pRVar4;
  undefined4 extraout_var;
  TestLog *pTVar5;
  RenderTarget *pRVar6;
  MessageBuilder *pMVar7;
  Enum<int,_2UL> EVar8;
  PixelBufferAccess local_250;
  GetNameFunc local_228;
  int local_220;
  Enum<int,_2UL> local_218;
  MessageBuilder local_208;
  GLenum local_84;
  GLuint local_80;
  deUint32 error;
  deUint32 max;
  deUint32 min;
  deInt64 indexLimit;
  VertexArray vao;
  Surface dst;
  undefined1 local_28 [4];
  deInt32 positionLoc;
  CallLogWrapper gl;
  DrawInvalidRangeCase *this_local;
  
  gl._16_8_ = this;
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  iVar1 = (*pRVar4->_vptr_RenderContext[3])();
  pTVar5 = tcu::TestContext::getLog((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
  glu::CallLogWrapper::CallLogWrapper
            ((CallLogWrapper *)local_28,(Functions *)CONCAT44(extraout_var,iVar1),pTVar5);
  dVar2 = glu::ShaderProgram::getProgram(this->m_program);
  index = glu::CallLogWrapper::glGetAttribLocation((CallLogWrapper *)local_28,dVar2,"a_position");
  pRVar6 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  iVar1 = tcu::RenderTarget::getWidth(pRVar6);
  pRVar6 = gles3::Context::getRenderTarget((this->super_TestCase).m_context);
  height = tcu::RenderTarget::getHeight(pRVar6);
  tcu::Surface::Surface((Surface *)&vao.super_ObjectWrapper.m_object,iVar1,height);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  glu::TypedObjectWrapper<(glu::ObjectType)5>::TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&indexLimit,pRVar4);
  _max = 0;
  error = this->m_min;
  local_80 = this->m_max;
  glu::CallLogWrapper::enableLogging((CallLogWrapper *)local_28,true);
  if (((this->m_useLimitMin & 1U) != 0) || ((this->m_useLimitMax & 1U) != 0)) {
    glu::CallLogWrapper::glGetInteger64v((CallLogWrapper *)local_28,0x8d6b,(GLint64 *)&max);
    GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
    glu::checkError(GVar3,"query limit",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                    ,0xa9);
  }
  if ((this->m_useLimitMin & 1U) != 0) {
    if (_max < 0x100000000) {
      error = (GLuint)_max - 0x10;
    }
    else {
      error = 0xfffffff0;
    }
  }
  if (((this->m_useLimitMax & 1U) != 0) && (local_80 = (GLuint)_max, 0xffffffff < _max)) {
    local_80 = 0xffffffff;
  }
  glu::CallLogWrapper::glClearColor((CallLogWrapper *)local_28,0.0,0.0,0.0,0.0);
  glu::CallLogWrapper::glClear((CallLogWrapper *)local_28,0x4000);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(GVar3,"setup",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xbe);
  dVar2 = glu::ShaderProgram::getProgram(this->m_program);
  glu::CallLogWrapper::glUseProgram((CallLogWrapper *)local_28,dVar2);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(GVar3,"use program",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xc1);
  dVar2 = glu::ObjectWrapper::operator*((ObjectWrapper *)&indexLimit);
  glu::CallLogWrapper::glBindVertexArray((CallLogWrapper *)local_28,dVar2);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)local_28,0x8893,this->m_indexBuffer);
  glu::CallLogWrapper::glBindBuffer((CallLogWrapper *)local_28,0x8892,this->m_buffer);
  glu::CallLogWrapper::glEnableVertexAttribArray((CallLogWrapper *)local_28,index);
  glu::CallLogWrapper::glVertexAttribPointer
            ((CallLogWrapper *)local_28,index,4,0x1406,'\0',0,(void *)0x0);
  GVar3 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  glu::checkError(GVar3,"set buffer",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/kaydenl[P]VK-GL-CTS/modules/gles3/stress/es3sDrawTests.cpp"
                  ,0xc9);
  glu::CallLogWrapper::glDrawRangeElements
            ((CallLogWrapper *)local_28,0,error,local_80,this->m_numIndices,0x1405,(void *)0x0);
  local_84 = glu::CallLogWrapper::glGetError((CallLogWrapper *)local_28);
  if (local_84 != 0) {
    pTVar5 = tcu::TestContext::getLog
                       ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx);
    tcu::TestLog::operator<<(&local_208,pTVar5,(BeginMessageToken *)&tcu::TestLog::Message);
    pMVar7 = tcu::MessageBuilder::operator<<(&local_208,(char (*) [12])0x2b45da6);
    EVar8 = glu::getErrorStr(local_84);
    local_228 = EVar8.m_getName;
    local_220 = EVar8.m_value;
    local_218.m_getName = local_228;
    local_218.m_value = local_220;
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,&local_218);
    pMVar7 = tcu::MessageBuilder::operator<<(pMVar7,(char (*) [14])", ignoring...");
    tcu::MessageBuilder::operator<<(pMVar7,(EndMessageToken *)&tcu::TestLog::EndMessage);
    tcu::MessageBuilder::~MessageBuilder(&local_208);
  }
  glu::CallLogWrapper::glFinish((CallLogWrapper *)local_28);
  pRVar4 = gles3::Context::getRenderContext((this->super_TestCase).m_context);
  tcu::Surface::getAccess(&local_250,(Surface *)&vao.super_ObjectWrapper.m_object);
  glu::readPixels(pRVar4,0,0,&local_250);
  tcu::TestContext::setTestResult
            ((this->super_TestCase).super_TestCase.super_TestNode.m_testCtx,QP_TEST_RESULT_PASS,
             "Pass");
  glu::TypedObjectWrapper<(glu::ObjectType)5>::~TypedObjectWrapper
            ((TypedObjectWrapper<(glu::ObjectType)5> *)&indexLimit);
  tcu::Surface::~Surface((Surface *)&vao.super_ObjectWrapper.m_object);
  glu::CallLogWrapper::~CallLogWrapper((CallLogWrapper *)local_28);
  return STOP;
}

Assistant:

DrawInvalidRangeCase::IterateResult DrawInvalidRangeCase::iterate (void)
{
	glu::CallLogWrapper		gl			(m_context.getRenderContext().getFunctions(), m_testCtx.getLog());
	const deInt32			positionLoc = gl.glGetAttribLocation(m_program->getProgram(), "a_position");
	tcu::Surface			dst			(m_context.getRenderTarget().getWidth(), m_context.getRenderTarget().getHeight());
	glu::VertexArray		vao			(m_context.getRenderContext());

	deInt64					indexLimit	= 0;
	deUint32				min			= m_min;
	deUint32				max			= m_max;

	gl.enableLogging(true);

	if (m_useLimitMin || m_useLimitMax)
	{
		gl.glGetInteger64v(GL_MAX_ELEMENT_INDEX, &indexLimit);
		GLU_EXPECT_NO_ERROR(gl.glGetError(), "query limit");
	}

	if (m_useLimitMin)
	{
		if ((deUint64)indexLimit > 0xFFFFFFFFULL)
			min = 0xFFFFFFF0;
		else
			min = (deUint32)(indexLimit - 16);
	}

	if (m_useLimitMax)
	{
		if ((deUint64)indexLimit > 0xFFFFFFFFULL)
			max = 0xFFFFFFFF;
		else
			max = (deUint32)indexLimit;
	}

	gl.glClearColor(0.0f, 0.0f, 0.0f, 0.0f);
	gl.glClear(GL_COLOR_BUFFER_BIT);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "setup");

	gl.glUseProgram(m_program->getProgram());
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "use program");

	gl.glBindVertexArray(*vao);
	gl.glBindBuffer(GL_ELEMENT_ARRAY_BUFFER, m_indexBuffer);

	gl.glBindBuffer(GL_ARRAY_BUFFER, m_buffer);
	gl.glEnableVertexAttribArray(positionLoc);
	gl.glVertexAttribPointer(positionLoc, 4, GL_FLOAT, GL_FALSE, 0, DE_NULL);
	GLU_EXPECT_NO_ERROR(gl.glGetError(), "set buffer");

	gl.glDrawRangeElements(GL_POINTS, min, max, m_numIndices, GL_UNSIGNED_INT, DE_NULL);

	// Indexing outside range is an error, but it doesnt need to be checked. Causes implementation-dependent behavior.
	// Even if the indices are in range (m_min = 0), the specification allows partial processing of vertices in the range,
	// which might cause access over buffer bounds. Causes implementation-dependent behavior.

	// allow errors
	{
		const deUint32 error = gl.glGetError();

		if (error != GL_NO_ERROR)
			m_testCtx.getLog() << tcu::TestLog::Message << "Got error: " << glu::getErrorStr(error) << ", ignoring..." << tcu::TestLog::EndMessage;
	}

	// read pixels to wait for rendering
	gl.glFinish();
	glu::readPixels(m_context.getRenderContext(), 0, 0, dst.getAccess());

	m_testCtx.setTestResult(QP_TEST_RESULT_PASS, "Pass");
	return STOP;
}